

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

void lzss_emit_match(rar *rar,int offset,int length)

{
  int64_t *piVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *__dest;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar7 = (rar->lzss).mask;
  uVar2 = (uint)(rar->lzss).position & uVar7;
  uVar6 = uVar2 - offset & uVar7;
  for (uVar4 = length; 0 < (int)uVar4; uVar4 = uVar4 - uVar8) {
    uVar8 = uVar6;
    if ((int)uVar6 < (int)uVar2) {
      uVar8 = uVar2;
    }
    uVar8 = (uVar7 - uVar8) + 1;
    if ((int)uVar4 < (int)uVar8) {
      uVar8 = uVar4;
    }
    puVar5 = (rar->lzss).window;
    __dest = puVar5 + (int)uVar2;
    puVar5 = puVar5 + (int)uVar6;
    if (((int)(uVar8 + uVar2) < (int)uVar6) || ((int)(uVar8 + uVar6) < (int)uVar2)) {
      memcpy(__dest,puVar5,(long)(int)uVar8);
    }
    else {
      for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
        __dest[uVar3] = puVar5[uVar3];
      }
    }
    uVar7 = (rar->lzss).mask;
    uVar2 = uVar8 + uVar2 & uVar7;
    uVar6 = uVar8 + uVar6 & uVar7;
  }
  piVar1 = &(rar->lzss).position;
  *piVar1 = *piVar1 + (long)length;
  return;
}

Assistant:

static inline void
lzss_emit_match(struct rar *rar, int offset, int length)
{
  int dstoffs = lzss_current_offset(&rar->lzss);
  int srcoffs = (dstoffs - offset) & lzss_mask(&rar->lzss);
  int l, li, remaining;
  unsigned char *d, *s;

  remaining = length;
  while (remaining > 0) {
    l = remaining;
    if (dstoffs > srcoffs) {
      if (l > lzss_size(&rar->lzss) - dstoffs)
        l = lzss_size(&rar->lzss) - dstoffs;
    } else {
      if (l > lzss_size(&rar->lzss) - srcoffs)
        l = lzss_size(&rar->lzss) - srcoffs;
    }
    d = &(rar->lzss.window[dstoffs]);
    s = &(rar->lzss.window[srcoffs]);
    if ((dstoffs + l < srcoffs) || (srcoffs + l < dstoffs))
      memcpy(d, s, l);
    else {
      for (li = 0; li < l; li++)
        d[li] = s[li];
    }
    remaining -= l;
    dstoffs = (dstoffs + l) & lzss_mask(&(rar->lzss));
    srcoffs = (srcoffs + l) & lzss_mask(&(rar->lzss));
  }
  rar->lzss.position += length;
}